

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O0

char * ucnv_io_nextStandardAliases
                 (UEnumeration *enumerator,int32_t *resultLength,UErrorCode *param_3)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  size_t sVar6;
  char *myStr;
  uint16_t *currList;
  uint32_t listCount;
  uint32_t listOffset;
  UAliasContext *myContext;
  UErrorCode *param_2_local;
  int32_t *resultLength_local;
  UEnumeration *enumerator_local;
  
  puVar5 = gMainTable.stringTable;
  puVar4 = gMainTable.taggedAliasLists;
  puVar3 = (uint *)enumerator->context;
  uVar1 = *puVar3;
  if ((uVar1 == 0) || ((uint)gMainTable.taggedAliasLists[uVar1] <= puVar3[1])) {
    if (resultLength != (int32_t *)0x0) {
      *resultLength = 0;
    }
    enumerator_local = (UEnumeration *)0x0;
  }
  else {
    uVar2 = puVar3[1];
    puVar3[1] = uVar2 + 1;
    enumerator_local = (UEnumeration *)(puVar5 + (int)(uint)puVar4[(ulong)uVar1 + (ulong)uVar2 + 1])
    ;
    if (resultLength != (int32_t *)0x0) {
      sVar6 = strlen((char *)enumerator_local);
      *resultLength = (int32_t)sVar6;
    }
  }
  return (char *)enumerator_local;
}

Assistant:

static const char * U_CALLCONV
ucnv_io_nextStandardAliases(UEnumeration *enumerator,
                            int32_t* resultLength,
                            UErrorCode * /*pErrorCode*/)
{
    UAliasContext *myContext = (UAliasContext *)(enumerator->context);
    uint32_t listOffset = myContext->listOffset;

    if (listOffset) {
        uint32_t listCount = gMainTable.taggedAliasLists[listOffset];
        const uint16_t *currList = gMainTable.taggedAliasLists + listOffset + 1;

        if (myContext->listIdx < listCount) {
            const char *myStr = GET_STRING(currList[myContext->listIdx++]);
            if (resultLength) {
                *resultLength = (int32_t)uprv_strlen(myStr);
            }
            return myStr;
        }
    }
    /* Either we accessed a zero length list, or we enumerated too far. */
    if (resultLength) {
        *resultLength = 0;
    }
    return NULL;
}